

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void rbuIndexCntFunc(sqlite3_context *pCtx,int nVal,sqlite3_value **apVal)

{
  sqlite3 *db;
  sqlite3_context *pCtx_00;
  int iVar1;
  uchar *puVar2;
  char *pcVar3;
  int local_40;
  int nIndex;
  int rc;
  char *zErrmsg;
  sqlite3_stmt *pStmt;
  sqlite3rbu *p;
  sqlite3_value **apVal_local;
  sqlite3_context *psStack_10;
  int nVal_local;
  sqlite3_context *pCtx_local;
  
  p = (sqlite3rbu *)apVal;
  apVal_local._4_4_ = nVal;
  psStack_10 = pCtx;
  pStmt = (sqlite3_stmt *)sqlite3_user_data(pCtx);
  zErrmsg = (char *)0x0;
  _nIndex = (char *)0x0;
  db = *(sqlite3 **)(pStmt + 8);
  puVar2 = sqlite3_value_text(*(sqlite3_value **)p);
  pcVar3 = sqlite3_mprintf("SELECT count(*) FROM sqlite_master WHERE type=\'index\' AND tbl_name = %Q"
                           ,puVar2);
  iVar1 = prepareFreeAndCollectError(db,(sqlite3_stmt **)&zErrmsg,(char **)&nIndex,pcVar3);
  if (iVar1 == 0) {
    local_40 = 0;
    iVar1 = sqlite3_step((sqlite3_stmt *)zErrmsg);
    if (iVar1 == 100) {
      local_40 = sqlite3_column_int((sqlite3_stmt *)zErrmsg,0);
    }
    iVar1 = sqlite3_finalize((sqlite3_stmt *)zErrmsg);
    pCtx_00 = psStack_10;
    if (iVar1 == 0) {
      sqlite3_result_int(psStack_10,local_40);
    }
    else {
      pcVar3 = sqlite3_errmsg(*(sqlite3 **)(pStmt + 8));
      sqlite3_result_error(pCtx_00,pcVar3,-1);
    }
  }
  else {
    sqlite3_result_error(psStack_10,_nIndex,-1);
  }
  sqlite3_free(_nIndex);
  return;
}

Assistant:

static void rbuIndexCntFunc(
  sqlite3_context *pCtx, 
  int nVal,
  sqlite3_value **apVal
){
  sqlite3rbu *p = (sqlite3rbu*)sqlite3_user_data(pCtx);
  sqlite3_stmt *pStmt = 0;
  char *zErrmsg = 0;
  int rc;

  assert( nVal==1 );
  
  rc = prepareFreeAndCollectError(p->dbMain, &pStmt, &zErrmsg, 
      sqlite3_mprintf("SELECT count(*) FROM sqlite_master "
        "WHERE type='index' AND tbl_name = %Q", sqlite3_value_text(apVal[0]))
  );
  if( rc!=SQLITE_OK ){
    sqlite3_result_error(pCtx, zErrmsg, -1);
  }else{
    int nIndex = 0;
    if( SQLITE_ROW==sqlite3_step(pStmt) ){
      nIndex = sqlite3_column_int(pStmt, 0);
    }
    rc = sqlite3_finalize(pStmt);
    if( rc==SQLITE_OK ){
      sqlite3_result_int(pCtx, nIndex);
    }else{
      sqlite3_result_error(pCtx, sqlite3_errmsg(p->dbMain), -1);
    }
  }

  sqlite3_free(zErrmsg);
}